

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintSection(TidyDocImpl *doc,uint indent,Node *node)

{
  int iVar1;
  uint saveWrap_00;
  uint mode;
  uint saveWrap;
  Bool wrapSect;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  iVar1 = (int)(doc->config).value[0x60].v;
  saveWrap_00 = WrapOffCond(doc,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  AddString(&doc->pprint,"<![");
  mode = 2;
  if (iVar1 != 0) {
    mode = 0x10;
  }
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"]>");
  WrapOn(doc,saveWrap_00);
  return;
}

Assistant:

static void PPrintSection( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapSect = cfgBool( doc, TidyWrapSection );
    uint saveWrap = WrapOffCond( doc, !wrapSect  );

    AddString( pprint, "<![" );
    PPrintText( doc, (wrapSect ? CDATA : COMMENT),
                indent, node );
    AddString( pprint, "]>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}